

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

void Bac_NtkCreateAndConnectBuffer(Gia_Man_t *pGia,Gia_Obj_t *pObj,Bac_Ntk_t *p,int iTerm)

{
  int iVar1;
  uint uVar2;
  Bac_ObjType_t Type;
  
  if (pGia == (Gia_Man_t *)0x0) {
    Type = BAC_BOX_CF;
  }
  else {
    iVar1 = Gia_ObjId(pGia,pObj);
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((int)(uVar2 & 0x1fffffff) < iVar1) {
      Bac_ObjAlloc(p,BAC_OBJ_BI,pObj[-(ulong)(uVar2 & 0x1fffffff)].Value);
      Type = BAC_BOX_INV - ((pObj->field_0x3 & 0x20) == 0);
    }
    else {
      Type = ((uVar2 >> 0x1d & 1) != 0) + BAC_BOX_CF;
    }
  }
  Bac_ObjAlloc(p,Type,-1);
  iVar1 = Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
  Bac_ObjSetFanin(p,iTerm,iVar1);
  return;
}

Assistant:

void Bac_NtkCreateAndConnectBuffer( Gia_Man_t * pGia, Gia_Obj_t * pObj, Bac_Ntk_t * p, int iTerm )
{
    int iObj;
    if ( pGia && Gia_ObjFaninId0p(pGia, pObj) > 0 )
    {
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BI, Gia_ObjFanin0(pObj)->Value );
        Bac_ObjAlloc( p, Gia_ObjFaninC0(pObj) ? BAC_BOX_INV : BAC_BOX_BUF, -1 );
    }
    else
    {
        Bac_ObjAlloc( p, pGia && Gia_ObjFaninC0(pObj) ? BAC_BOX_CT : BAC_BOX_CF, -1 );
    }
    iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    Bac_ObjSetFanin( p, iTerm, iObj );
}